

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O0

SHEMU_STATUS ShemuMemFetch(SHEMU_CONTEXT *Context,ND_UINT64 Gla,ND_UINT64 Size,ND_UINT8 *Bytes)

{
  ND_BOOL NVar1;
  ND_UINT64 local_48;
  long local_40;
  ND_UINT64 offset;
  ND_UINT8 *addr;
  ND_UINT8 *Bytes_local;
  ND_UINT64 Size_local;
  ND_UINT64 Gla_local;
  SHEMU_CONTEXT *Context_local;
  
  if ((Size < 0x101) && (Size != 0)) {
    NVar1 = ShemuIsShellcodePtr(Context,Gla,Size);
    if (NVar1 == '\0') {
      Context_local._4_4_ = 2;
    }
    else {
      offset = (ND_UINT64)Context->Shellcode;
      local_40 = Gla - Context->ShellcodeBase;
      if ((Context->Options & 0x20) != 0) {
        NVar1 = ShemuIsIcachePtr(Context,Gla,1);
        if ((NVar1 == '\0') || (NVar1 = ShemuIsIcachePtr(Context,(Gla + Size) - 1,1), NVar1 == '\0')
           ) {
          (Context->Icache).Address = Gla;
          if (Context->ShellcodeSize - local_40 < 0x100) {
            local_48 = Context->ShellcodeSize - local_40;
          }
          else {
            local_48 = 0x100;
          }
          (Context->Icache).Size = local_48;
          if ((Context->Icache).Size < Size) {
            return 2;
          }
          if ((Context->AccessShellcode == (ShemuMemAccess)0x0) ||
             (NVar1 = (*Context->AccessShellcode)
                                (Context,Gla,(Context->Icache).Size,(Context->Icache).Icache,'\0'),
             NVar1 == '\0')) {
            return 0xf;
          }
        }
        offset = (ND_UINT64)&Context->Icache;
        local_40 = Gla - (Context->Icache).Address;
      }
      shemu_memcpy(Bytes,(void *)(offset + local_40),Size);
      Context_local._4_4_ = 0;
    }
  }
  else {
    Context_local._4_4_ = 7;
  }
  return Context_local._4_4_;
}

Assistant:

SHEMU_STATUS
ShemuMemFetch(
    SHEMU_CONTEXT *Context,
    ND_UINT64 Gla,
    ND_UINT64 Size,
    ND_UINT8 *Bytes
    )
{
    ND_UINT8 *addr;
    ND_UINT64 offset;

    if (Size > SHEMU_ICACHE_SIZE || Size == 0)
    {
        return SHEMU_ABORT_INVALID_PARAMETER;
    }

    if (!ShemuIsShellcodePtr(Context, Gla, Size))
    {
        return SHEMU_ABORT_RIP_OUTSIDE;
    }

    addr = Context->Shellcode;
    offset = Gla - Context->ShellcodeBase;

    if (0 != (Context->Options & SHEMU_OPT_DIRECT_MAPPED_SHELL))
    {
        // If the entire address is NOT inside the cache, re-fill the entire line, starting with Gla.
        if (!ShemuIsIcachePtr(Context, Gla, 1) || !ShemuIsIcachePtr(Context, Gla + Size - 1, 1))
        {
            // Re-fill the line.
            Context->Icache.Address = Gla;
            Context->Icache.Size = MIN(SHEMU_ICACHE_SIZE, Context->ShellcodeSize - offset);

            if (Context->Icache.Size < Size)
            {
                return SHEMU_ABORT_RIP_OUTSIDE;
            }

            if ((ND_NULL == Context->AccessShellcode) || 
                !Context->AccessShellcode(Context, Gla, (ND_SIZET)Context->Icache.Size, Context->Icache.Icache, ND_FALSE))
            {
                return SHEMU_ABORT_FETCH_ERROR;
            }
        }

        addr = Context->Icache.Icache;
        offset = Gla - Context->Icache.Address;
    }

    shemu_memcpy(Bytes, addr + offset, (ND_SIZET)Size);

    return SHEMU_SUCCESS;
}